

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine_alpha.cpp
# Opt level: O0

void __thiscall
QAlphaPaintEngine::drawPolygon
          (QAlphaPaintEngine *this,QPointF *points,int pointCount,PolygonDrawMode mode)

{
  bool bVar1;
  QAlphaPaintEnginePrivate *this_00;
  undefined4 in_ECX;
  int in_EDX;
  QAlphaPaintEnginePrivate *in_RSI;
  QRectF *in_RDI;
  long in_FS_OFFSET;
  int i;
  QAlphaPaintEnginePrivate *d;
  QRectF tr;
  QPainterPath path;
  QPolygonF poly;
  parameter_type in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff90;
  int iVar2;
  QList<QPointF> *in_stack_ffffffffffffffb8;
  undefined1 somethingInRectHasAlpha;
  QAlphaPaintEnginePrivate *this_01;
  undefined8 local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  qsizetype asize;
  
  asize = *(qsizetype *)(in_FS_OFFSET + 0x28);
  this_00 = d_func((QAlphaPaintEngine *)0x12a442);
  local_20 = 0xaaaaaaaaaaaaaaaa;
  local_18 = 0xaaaaaaaaaaaaaaaa;
  local_10 = 0xaaaaaaaaaaaaaaaa;
  QPolygonF::QPolygonF((QPolygonF *)0x12a475);
  QList<QPointF>::reserve(in_stack_ffffffffffffffb8,asize);
  for (iVar2 = 0; iVar2 < in_EDX; iVar2 = iVar2 + 1) {
    QList<QPointF>::append
              ((QList<QPointF> *)CONCAT44(iVar2,in_stack_ffffffffffffff90),in_stack_ffffffffffffff88
              );
  }
  local_28 = 0xaaaaaaaaaaaaaaaa;
  QPainterPath::QPainterPath((QPainterPath *)&local_28);
  QPainterPath::addPolygon((QPolygonF *)&local_28);
  somethingInRectHasAlpha = 0xff;
  this_01 = (QAlphaPaintEnginePrivate *)0xffffffffffffffff;
  QAlphaPaintEnginePrivate::addPenWidth(in_RSI,(QPainterPath *)CONCAT44(in_EDX,in_ECX));
  if (this_00->m_pass == 0) {
    this_00->m_continueCall = false;
    bVar1 = QAlphaPaintEnginePrivate::canSeeTroughBackground
                      (this_01,(bool)somethingInRectHasAlpha,in_RDI);
    if ((((bVar1) || ((this_00->m_advancedPen & 1U) != 0)) || ((this_00->m_advancedBrush & 1U) != 0)
        ) || ((this_00->m_emulateProjectiveTransforms & 1U) != 0)) {
      QAlphaPaintEnginePrivate::addAlphaRect
                ((QAlphaPaintEnginePrivate *)CONCAT44(in_EDX,in_ECX),(QRectF *)this_00);
    }
    QAlphaPaintEnginePrivate::addDirtyRect
              (this_00,(QRectF *)CONCAT44(iVar2,in_stack_ffffffffffffff90));
    if (this_00->m_picengine != (QPaintEngine *)0x0) {
      (**(code **)(*(long *)this_00->m_picengine + 0x70))(this_00->m_picengine,in_RSI,in_EDX,in_ECX)
      ;
    }
  }
  else {
    bVar1 = QAlphaPaintEnginePrivate::fullyContained(in_RSI,(QRectF *)CONCAT44(in_EDX,in_ECX));
    this_00->m_continueCall = (bool)((bVar1 ^ 0xffU) & 1);
  }
  QPainterPath::~QPainterPath((QPainterPath *)&local_28);
  QPolygonF::~QPolygonF((QPolygonF *)0x12a616);
  if (*(long *)(in_FS_OFFSET + 0x28) != asize) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void QAlphaPaintEngine::drawPolygon(const QPointF *points, int pointCount, PolygonDrawMode mode)
{
    Q_D(QAlphaPaintEngine);

    QPolygonF poly;
    poly.reserve(pointCount);
    for (int i = 0; i < pointCount; ++i)
        poly.append(points[i]);

    QPainterPath path;
    path.addPolygon(poly);
    QRectF tr = d->addPenWidth(path);

    if (d->m_pass == 0) {
        d->m_continueCall = false;
        if (d->canSeeTroughBackground(d->m_hasalpha, tr) || d->m_advancedPen || d->m_advancedBrush
            || d->m_emulateProjectiveTransforms)
        {
            d->addAlphaRect(tr);
        }

        d->addDirtyRect(tr);

        if (d->m_picengine)
            d->m_picengine->drawPolygon(points, pointCount, mode);
    } else {
        d->m_continueCall = !d->fullyContained(tr);
    }
}